

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrammarTable.cpp
# Opt level: O1

string * rtrim(string *s)

{
  byte bVar1;
  pointer pcVar2;
  locale *plVar3;
  ctype *pcVar4;
  long lVar5;
  pointer pcVar6;
  pointer pcVar7;
  
  pcVar2 = (s->_M_dataplus)._M_p;
  pcVar7 = pcVar2 + s->_M_string_length;
  lVar5 = (long)s->_M_string_length >> 2;
  pcVar6 = pcVar7;
  if (0 < lVar5) {
    pcVar6 = pcVar7 + lVar5 * -4;
    lVar5 = lVar5 + 1;
    do {
      bVar1 = pcVar7[-1];
      plVar3 = (locale *)std::locale::classic();
      pcVar4 = std::use_facet<std::ctype<char>>(plVar3);
      if ((*(byte *)(*(long *)(pcVar4 + 0x30) + 1 + (ulong)bVar1 * 2) & 0x20) == 0)
      goto LAB_00105f34;
      bVar1 = pcVar7[-2];
      plVar3 = (locale *)std::locale::classic();
      pcVar4 = std::use_facet<std::ctype<char>>(plVar3);
      if ((*(byte *)(*(long *)(pcVar4 + 0x30) + 1 + (ulong)bVar1 * 2) & 0x20) == 0) {
        pcVar7 = pcVar7 + -1;
        goto LAB_00105f34;
      }
      bVar1 = pcVar7[-3];
      plVar3 = (locale *)std::locale::classic();
      pcVar4 = std::use_facet<std::ctype<char>>(plVar3);
      if ((*(byte *)(*(long *)(pcVar4 + 0x30) + 1 + (ulong)bVar1 * 2) & 0x20) == 0) {
        pcVar7 = pcVar7 + -2;
        goto LAB_00105f34;
      }
      bVar1 = pcVar7[-4];
      plVar3 = (locale *)std::locale::classic();
      pcVar4 = std::use_facet<std::ctype<char>>(plVar3);
      if ((*(byte *)(*(long *)(pcVar4 + 0x30) + 1 + (ulong)bVar1 * 2) & 0x20) == 0) {
        pcVar7 = pcVar7 + -3;
        goto LAB_00105f34;
      }
      pcVar7 = pcVar7 + -4;
      lVar5 = lVar5 + -1;
    } while (1 < lVar5);
  }
  lVar5 = (long)pcVar6 - (long)pcVar2;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      pcVar7 = pcVar2;
      if (lVar5 != 3) goto LAB_00105f34;
      bVar1 = pcVar6[-1];
      plVar3 = (locale *)std::locale::classic();
      pcVar4 = std::use_facet<std::ctype<char>>(plVar3);
      pcVar7 = pcVar6;
      if ((*(byte *)(*(long *)(pcVar4 + 0x30) + 1 + (ulong)bVar1 * 2) & 0x20) == 0)
      goto LAB_00105f34;
      pcVar6 = pcVar6 + -1;
    }
    bVar1 = pcVar6[-1];
    plVar3 = (locale *)std::locale::classic();
    pcVar4 = std::use_facet<std::ctype<char>>(plVar3);
    pcVar7 = pcVar6;
    if ((*(byte *)(*(long *)(pcVar4 + 0x30) + 1 + (ulong)bVar1 * 2) & 0x20) == 0) goto LAB_00105f34;
    pcVar6 = pcVar6 + -1;
  }
  bVar1 = pcVar6[-1];
  plVar3 = (locale *)std::locale::classic();
  pcVar4 = std::use_facet<std::ctype<char>>(plVar3);
  pcVar7 = pcVar6;
  if ((*(byte *)(*(long *)(pcVar4 + 0x30) + 1 + (ulong)bVar1 * 2) & 0x20) != 0) {
    pcVar7 = pcVar2;
  }
LAB_00105f34:
  s->_M_string_length = (long)pcVar7 - (long)(s->_M_dataplus)._M_p;
  *pcVar7 = '\0';
  return s;
}

Assistant:

std::string &rtrim(std::string &s)
{
    auto it = std::find_if(s.rbegin(), s.rend(),
                           [](char c)
                           {
                               return !std::isspace<char>(c, std::locale::classic());
                           });
    s.erase(it.base(), s.end());
    return s;
}